

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_ec29ae::Helper::MakeFilesFullPath
          (Helper *this,char *modeName,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *relFiles,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *absFiles)

{
  pointer pbVar1;
  pointer pcVar2;
  char *pcVar3;
  bool bVar4;
  size_type sVar5;
  pointer pbVar6;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string file;
  string local_f8;
  Helper *local_d8;
  char *local_d0;
  string *local_c8;
  string local_c0;
  string local_90;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  undefined8 local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  size_type local_50;
  pointer local_48;
  undefined8 local_40;
  char *local_38;
  
  local_d8 = this;
  local_d0 = modeName;
  local_c8 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this->Makefile);
  pbVar6 = (relFiles->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (relFiles->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pbVar6 == pbVar1) {
      return true;
    }
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    pcVar2 = (pbVar6->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f8,pcVar2,pcVar2 + pbVar6->_M_string_length);
    sVar5 = cmGeneratorExpression::Find(&local_f8);
    if (sVar5 != 0) {
      bVar4 = cmsys::SystemTools::FileIsFullPath(&local_f8);
      if (!bVar4) {
        local_70._M_str = (local_c8->_M_dataplus)._M_p;
        local_70._M_len = local_c8->_M_string_length;
        local_c0._M_dataplus._M_p = (pointer)0x1;
        local_c0._M_string_length = (size_type)&local_c0.field_2;
        local_c0.field_2._M_local_buf[0] = '/';
        local_60 = 1;
        local_48 = (pbVar6->_M_dataplus)._M_p;
        local_50 = pbVar6->_M_string_length;
        views._M_len = 3;
        views._M_array = &local_70;
        local_58 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_c0._M_string_length;
        cmCatViews_abi_cxx11_(&local_90,views);
        std::__cxx11::string::operator=((string *)&local_f8,(string *)&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
      }
      if (((sVar5 == 0xffffffffffffffff) &&
          (bVar4 = cmsys::SystemTools::FileIsSymlink(&local_f8), !bVar4)) &&
         (bVar4 = cmsys::SystemTools::FileIsDirectory(&local_f8), pcVar3 = local_d0, bVar4)) {
        local_70._M_len = strlen(local_d0);
        local_70._M_str = pcVar3;
        local_60 = 0x12;
        local_58 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x6fc4b8;
        local_48 = (pbVar6->_M_dataplus)._M_p;
        local_50 = pbVar6->_M_string_length;
        local_40 = 0xd;
        local_38 = "\" to install.";
        views_00._M_len = 4;
        views_00._M_array = &local_70;
        cmCatViews_abi_cxx11_(&local_c0,views_00);
        std::__cxx11::string::_M_assign((string *)&local_d8->Status->Error);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,
                          CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                                   local_c0.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        return false;
      }
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)absFiles,
               &local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    pbVar6 = pbVar6 + 1;
  } while( true );
}

Assistant:

bool Helper::MakeFilesFullPath(const char* modeName,
                               const std::vector<std::string>& relFiles,
                               std::vector<std::string>& absFiles)
{
  return this->MakeFilesFullPath(
    modeName, this->Makefile->GetCurrentSourceDirectory(), relFiles, absFiles);
}